

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

void __thiscall QFont::setOverline(QFont *this,bool enable)

{
  byte bVar1;
  QFontPrivate *pQVar2;
  byte in_SIL;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  bVar1 = in_SIL & 1;
  if (((*(uint *)(in_RDI + 8) & 0x80) == 0) ||
     (pQVar2 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QFontPrivate> *)0x712377),
     ((byte)pQVar2->field_0x7c >> 1 & 1) != bVar1)) {
    QFontPrivate::detachButKeepEngineData
              ((QFont *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    pQVar2 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x7123b2);
    pQVar2->field_0x7c = pQVar2->field_0x7c & 0xfd | (bVar1 & 1) << 1;
    *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 0x80;
  }
  return;
}

Assistant:

void QFont::setOverline(bool enable)
{
    if ((resolve_mask & QFont::OverlineResolved) && d->overline == enable)
        return;

    QFontPrivate::detachButKeepEngineData(this);

    d->overline = enable;
    resolve_mask |= QFont::OverlineResolved;
}